

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymacro.c
# Opt level: O2

wchar_t node__delete(EditLine *el,keymacro_node_t **inptr,wchar_t *str)

{
  wchar_t wVar1;
  EditLine *pEVar2;
  EditLine *el_00;
  EditLine *pEVar3;
  
  el_00 = (EditLine *)el->el_prog;
  if (*(wchar_t *)&el_00->el_prog == *(wchar_t *)inptr) {
    if (*(int *)((long)inptr + 4) == 0) {
LAB_0010ba45:
      el->el_prog = &el_00->el_errfile->_flags;
      goto LAB_0010ba4c;
    }
    pEVar3 = (EditLine *)0x0;
  }
  else {
    do {
      pEVar3 = el_00;
      el_00 = (EditLine *)pEVar3->el_errfile;
      if (el_00 == (EditLine *)0x0) {
        return L'\0';
      }
    } while (*(wchar_t *)&el_00->el_prog != *(wchar_t *)inptr);
    if (*(int *)((long)inptr + 4) == 0) {
      el = (EditLine *)&pEVar3->el_errfile;
      goto LAB_0010ba45;
    }
  }
  inptr = (keymacro_node_t **)((long)inptr + 4);
  if (el_00->el_outfile == (FILE_conflict *)0x0) {
    return L'\0';
  }
  wVar1 = node__delete((EditLine *)&el_00->el_outfile,inptr,str);
  if (wVar1 == L'\0') {
    return L'\0';
  }
  if (el_00->el_outfile != (FILE_conflict *)0x0) {
    return L'\0';
  }
  pEVar2 = (EditLine *)&pEVar3->el_errfile;
  if (pEVar3 == (EditLine *)0x0) {
    pEVar2 = el;
  }
  pEVar2->el_prog = &el_00->el_errfile->_flags;
LAB_0010ba4c:
  el_00->el_errfile = (FILE_conflict *)0x0;
  node__put(el_00,(keymacro_node_t *)inptr);
  return L'\x01';
}

Assistant:

static int
node__delete(EditLine *el, keymacro_node_t **inptr, const wchar_t *str)
{
	keymacro_node_t *ptr;
	keymacro_node_t *prev_ptr = NULL;

	ptr = *inptr;

	if (ptr->ch != *str) {
		keymacro_node_t *xm;

		for (xm = ptr; xm->sibling != NULL; xm = xm->sibling)
			if (xm->sibling->ch == *str)
				break;
		if (xm->sibling == NULL)
			return 0;
		prev_ptr = xm;
		ptr = xm->sibling;
	}
	if (*++str == '\0') {
		/* we're there */
		if (prev_ptr == NULL)
			*inptr = ptr->sibling;
		else
			prev_ptr->sibling = ptr->sibling;
		ptr->sibling = NULL;
		node__put(el, ptr);
		return 1;
	} else if (ptr->next != NULL &&
	    node__delete(el, &ptr->next, str) == 1) {
		if (ptr->next != NULL)
			return 0;
		if (prev_ptr == NULL)
			*inptr = ptr->sibling;
		else
			prev_ptr->sibling = ptr->sibling;
		ptr->sibling = NULL;
		node__put(el, ptr);
		return 1;
	} else {
		return 0;
	}
}